

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RBBISymbolTable::parseReference
          (UnicodeString *__return_storage_ptr__,RBBISymbolTable *this,UnicodeString *text,
          ParsePosition *pos,int32_t limit)

{
  uint offset;
  uint uVar1;
  int iVar2;
  UBool UVar3;
  char16_t cVar4;
  int iVar5;
  
  uVar1 = pos->index;
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0024c170;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  iVar2 = 0;
  do {
    iVar5 = iVar2;
    offset = uVar1 + iVar5;
    if (limit <= (int)offset) break;
    cVar4 = UnicodeString::doCharAt(text,offset);
    if ((iVar5 == 0) && (UVar3 = u_isIDStart_63((uint)(ushort)cVar4), UVar3 == '\0')) {
      return __return_storage_ptr__;
    }
    UVar3 = u_isIDPart_63((uint)(ushort)cVar4);
    iVar2 = iVar5 + 1;
  } while (UVar3 != '\0');
  if (iVar5 != 0) {
    pos->index = offset;
    (*(text->super_Replaceable).super_UObject._vptr_UObject[3])
              (text,(ulong)uVar1,(ulong)offset,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString   RBBISymbolTable::parseReference(const UnicodeString& text,
                                                ParsePosition& pos, int32_t limit) const
{
    int32_t start = pos.getIndex();
    int32_t i = start;
    UnicodeString result;
    while (i < limit) {
        UChar c = text.charAt(i);
        if ((i==start && !u_isIDStart(c)) || !u_isIDPart(c)) {
            break;
        }
        ++i;
    }
    if (i == start) { // No valid name chars
        return result; // Indicate failure with empty string
    }
    pos.setIndex(i);
    text.extractBetween(start, i, result);
    return result;
}